

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

int __thiscall QTlsBackend::curveIdFromLongName(QTlsBackend *this,QString *name)

{
  bool bVar1;
  QString *in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff88;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this_00;
  QDebug *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffd8;
  QDebug local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QtPrivateLogging::lcSsl();
  anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_RDI,in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x277811);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RSI,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff88,(char *)0x277827);
    QMessageLogger::warning();
    in_stack_ffffffffffffff88 =
         (QLoggingCategory *)QDebug::operator<<(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd8)
    ;
    (*(code *)in_RDI->category[6].d)(&stack0xffffffffffffffa8);
    QDebug::operator<<((QDebug *)this_00,in_RSI);
    QDebug::operator<<(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd8);
    QString::~QString((QString *)0x277885);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTlsBackend::curveIdFromLongName(const QString &name) const
{
    Q_UNUSED(name);
    REPORT_MISSING_SUPPORT("does not support QSslEllipticCurve");
    return 0;
}